

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.h
# Opt level: O0

_Bool dict_repeat(lzma_dict *dict,uint32_t distance,uint32_t *len)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  ulong local_40;
  uint32_t copy_size;
  uint32_t copy_pos;
  uint32_t left;
  size_t dict_avail;
  uint32_t *len_local;
  uint32_t distance_local;
  lzma_dict *dict_local;
  
  local_40 = dict->limit - dict->pos;
  if (*len <= local_40) {
    local_40 = (ulong)*len;
  }
  copy_size = (uint32_t)local_40;
  *len = *len - copy_size;
  if (distance < copy_size) {
    do {
      uVar1 = dict_get(dict,distance);
      dict->buf[dict->pos] = uVar1;
      dict->pos = dict->pos + 1;
      copy_size = copy_size - 1;
    } while (copy_size != 0);
  }
  else if ((ulong)distance < dict->pos) {
    memcpy(dict->buf + dict->pos,dict->buf + (dict->pos - (ulong)distance) + -1,
           local_40 & 0xffffffff);
    dict->pos = (local_40 & 0xffffffff) + dict->pos;
  }
  else {
    if (dict->full != dict->size) {
      __assert_fail("dict->full == dict->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.h"
                    ,0xa0,"_Bool dict_repeat(lzma_dict *, uint32_t, uint32_t *)");
    }
    uVar2 = ((int)dict->pos - distance) + -1 + (int)dict->size;
    uVar3 = (int)dict->size - uVar2;
    if (uVar3 < copy_size) {
      memmove(dict->buf + dict->pos,dict->buf + uVar2,(ulong)uVar3);
      dict->pos = (ulong)uVar3 + dict->pos;
      memcpy(dict->buf + dict->pos,dict->buf,(ulong)(copy_size - uVar3));
      dict->pos = (ulong)(copy_size - uVar3) + dict->pos;
    }
    else {
      memmove(dict->buf + dict->pos,dict->buf + uVar2,local_40 & 0xffffffff);
      dict->pos = (local_40 & 0xffffffff) + dict->pos;
    }
  }
  if (dict->full < dict->pos) {
    dict->full = dict->pos;
  }
  return *len != 0;
}

Assistant:

static inline bool
dict_repeat(lzma_dict *dict, uint32_t distance, uint32_t *len)
{
	// Don't write past the end of the dictionary.
	const size_t dict_avail = dict->limit - dict->pos;
	uint32_t left = my_min(dict_avail, *len);
	*len -= left;

	// Repeat a block of data from the history. Because memcpy() is faster
	// than copying byte by byte in a loop, the copying process gets split
	// into three cases.
	if (distance < left) {
		// Source and target areas overlap, thus we can't use
		// memcpy() nor even memmove() safely.
		do {
			dict->buf[dict->pos] = dict_get(dict, distance);
			++dict->pos;
		} while (--left > 0);

	} else if (distance < dict->pos) {
		// The easiest and fastest case
		memcpy(dict->buf + dict->pos,
				dict->buf + dict->pos - distance - 1,
				left);
		dict->pos += left;

	} else {
		uint32_t copy_pos;
		uint32_t copy_size;

		// The bigger the dictionary, the more rare this
		// case occurs. We need to "wrap" the dict, thus
		// we might need two memcpy() to copy all the data.
		assert(dict->full == dict->size);
		copy_pos = dict->pos - distance - 1 + dict->size;
		copy_size = dict->size - copy_pos;

		if (copy_size < left) {
			memmove(dict->buf + dict->pos, dict->buf + copy_pos,
					copy_size);
			dict->pos += copy_size;
			copy_size = left - copy_size;
			memcpy(dict->buf + dict->pos, dict->buf, copy_size);
			dict->pos += copy_size;
		} else {
			memmove(dict->buf + dict->pos, dict->buf + copy_pos,
					left);
			dict->pos += left;
		}
	}

	// Update how full the dictionary is.
	if (dict->full < dict->pos)
		dict->full = dict->pos;

	return unlikely(*len != 0);
}